

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_buffer.c
# Opt level: O0

void test_cio_write_buffer_splice_empty_list(void)

{
  size_t sVar1;
  undefined1 local_68 [8];
  cio_write_buffer list_to_append;
  cio_write_buffer wbe;
  cio_write_buffer wbh;
  
  cio_write_buffer_head_init((cio_write_buffer *)((long)&wbe.data + 8));
  cio_write_buffer_element_init((cio_write_buffer *)((long)&list_to_append.data + 8),(void *)0x0,0);
  cio_write_buffer_queue_tail
            ((cio_write_buffer *)((long)&wbe.data + 8),
             (cio_write_buffer *)((long)&list_to_append.data + 8));
  sVar1 = cio_write_buffer_get_num_buffer_elements((cio_write_buffer *)((long)&wbe.data + 8));
  UnityAssertEqualNumber
            (1,sVar1,"Number of elements in write buffer not correct!",0x10b,UNITY_DISPLAY_STYLE_INT
            );
  cio_write_buffer_head_init((cio_write_buffer *)local_68);
  cio_write_buffer_splice((cio_write_buffer *)local_68,(cio_write_buffer *)((long)&wbe.data + 8));
  sVar1 = cio_write_buffer_get_num_buffer_elements((cio_write_buffer *)((long)&wbe.data + 8));
  UnityAssertEqualNumber
            (1,sVar1,"Number of elements in write buffer not correct!",0x110,UNITY_DISPLAY_STYLE_INT
            );
  return;
}

Assistant:

static void test_cio_write_buffer_splice_empty_list(void)
{
	struct cio_write_buffer wbh;
	cio_write_buffer_head_init(&wbh);

	struct cio_write_buffer wbe;
	cio_write_buffer_element_init(&wbe, NULL, 0);
	cio_write_buffer_queue_tail(&wbh, &wbe);
	TEST_ASSERT_EQUAL_MESSAGE(1, cio_write_buffer_get_num_buffer_elements(&wbh), "Number of elements in write buffer not correct!");

	struct cio_write_buffer list_to_append;
	cio_write_buffer_head_init(&list_to_append);
	cio_write_buffer_splice(&list_to_append, &wbh);
	TEST_ASSERT_EQUAL_MESSAGE(1, cio_write_buffer_get_num_buffer_elements(&wbh), "Number of elements in write buffer not correct!");
}